

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O3

void __thiscall
rtb::Filter::Polynomial<double>::removeHighOrderZeroCoefficients(Polynomial<double> *this)

{
  size_t sVar1;
  pointer pcVar2;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *__range2;
  double dVar3;
  reverse_iterator<__gnu_cxx::__normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
  it;
  pointer local_28;
  pointer local_20;
  pointer local_18;
  
  local_18 = (this->coefficients_).
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  dVar3 = 0.0;
  local_20 = (this->coefficients_).
             super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
  for (pcVar2 = local_20; pcVar2 != local_18; pcVar2 = pcVar2 + 1) {
    dVar3 = dVar3 + *(double *)pcVar2->_M_value;
  }
  if (0x10 < (ulong)((long)local_18 - (long)local_20)) {
    dVar3 = cabs(dVar3);
    local_20 = (this->coefficients_).
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
    local_18 = (this->coefficients_).
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    if ((dVar3 != 0.0) || (NAN(dVar3))) {
      std::
      __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<std::complex<double>*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>>,__gnu_cxx::__ops::_Iter_pred<rtb::Filter::Polynomial<double>::removeHighOrderZeroCoefficients()::_lambda(std::complex<double>)_1_>>
                (&local_28);
      if (local_28 !=
          (this->coefficients_).
          super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        (this->coefficients_).
        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>._M_impl.
        super__Vector_impl_data._M_finish = local_28;
      }
      local_20 = (this->coefficients_).
                 super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      local_18 = local_28;
    }
  }
  sVar1 = (long)local_18 - (long)local_20 >> 4;
  this->size_ = sVar1;
  this->order_ = sVar1 - 1;
  return;
}

Assistant:

void Polynomial<T>::removeHighOrderZeroCoefficients() {

            Complex sum(0);
            for (auto c : coefficients_)
                sum += c;

            if (coefficients_.size() > 1 && std::abs(sum) != 0) {
                auto it = std::find_if(coefficients_.rbegin(), coefficients_.rend(), [](Complex v){ return std::abs(v) != 0;      });
                coefficients_.erase(it.base(), coefficients_.end());
            }
            updateOrderAndSize();
        }